

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::GetDirectBufferPointer
          (EpsCopyOutputStream *this,void **data,int *size,uint8 **pp)

{
  int iVar1;
  uint uVar2;
  uint8 *puVar3;
  long *in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  EpsCopyOutputStream *in_RDI;
  uint8 *in_stack_000000e0;
  EpsCopyOutputStream *in_stack_000000e8;
  
  if ((in_RDI->had_error_ & 1U) == 0) {
    iVar1 = Flush(in_stack_000000e8,in_stack_000000e0);
    *in_RDX = iVar1;
    if ((in_RDI->had_error_ & 1U) == 0) {
      *in_RSI = in_RDI->buffer_end_;
      do {
        if (*in_RDX != 0) {
          puVar3 = SetInitialBuffer(in_RDI,(void *)*in_RSI,*in_RDX);
          *in_RCX = (long)puVar3;
          return true;
        }
        uVar2 = (*in_RDI->stream_->_vptr_ZeroCopyOutputStream[2])(in_RDI->stream_,in_RSI,in_RDX);
      } while ((uVar2 & 1) != 0);
      puVar3 = Error(in_RDI);
      *in_RCX = (long)puVar3;
    }
    else {
      *in_RCX = (long)in_RDI->buffer_;
    }
  }
  else {
    *in_RCX = (long)in_RDI->buffer_;
  }
  return false;
}

Assistant:

bool EpsCopyOutputStream::GetDirectBufferPointer(void** data, int* size,
                                                 uint8** pp) {
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  *size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  *data = buffer_end_;
  while (*size == 0) {
    if (!stream_->Next(data, size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(*data, *size);
  return true;
}